

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void CheckSvgAttr(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  TidyAttrId TVar1;
  int iVar2;
  Bool BVar3;
  uint code;
  ctmbstr *list;
  
  if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_SVG)) {
    code = 0x227;
    goto LAB_00136316;
  }
  if (attval == (AttVal *)0x0) {
    return;
  }
  if (attval->dict == (Attribute *)0x0) {
    return;
  }
  TVar1 = attval->dict->id;
  if ((0xd < TVar1 - TidyAttr_FILL) && (TVar1 != TidyAttr_COLOR)) {
    return;
  }
  if (attval->value == (ctmbstr)0x0) {
    code = 0x256;
    goto LAB_00136316;
  }
  iVar2 = prvTidytmbstrcasecmp(attval->value,"inherit");
  if ((iVar2 == 0) || (attval->dict == (Attribute *)0x0)) {
switchD_001362f3_default:
    return;
  }
  switch(attval->dict->id) {
  case TidyAttr_FILL:
  case TidyAttr_STROKE:
    BVar3 = AttrValueIsAmong(attval,CheckSvgAttr::values);
    if (BVar3 == no) {
      CheckColor(doc,node,attval);
      return;
    }
    goto LAB_001363c0;
  case TidyAttr_FILLRULE:
    list = CheckSvgAttr::values_1;
    break;
  case TidyAttr_STROKEDASHARRAY:
    BVar3 = AttrValueIsAmong(attval,CheckSvgAttr::values_2);
    if (BVar3 == no) {
      return;
    }
    goto LAB_001363c0;
  case TidyAttr_STROKEDASHOFFSET:
  case TidyAttr_STROKEWIDTH:
    CheckLength(doc,node,attval);
    return;
  case TidyAttr_STROKELINECAP:
    list = CheckSvgAttr::values_3;
    break;
  case TidyAttr_STROKELINEJOIN:
    list = CheckSvgAttr::values_4;
    break;
  case TidyAttr_STROKEMITERLIMIT:
    CheckNumber(doc,node,attval);
    return;
  case TidyAttr_COLORINTERPOLATION:
    list = CheckSvgAttr::values_5;
    break;
  case TidyAttr_COLORRENDERING:
    list = CheckSvgAttr::values_6;
    break;
  case TidyAttr_OPACITY:
  case TidyAttr_STROKEOPACITY:
  case TidyAttr_FILLOPACITY:
    CheckDecimal(doc,node,attval);
    return;
  default:
    goto switchD_001362f3_default;
  }
  BVar3 = AttrValueIsAmong(attval,list);
  if (BVar3 == no) {
    code = 0x22b;
LAB_00136316:
    prvTidyReportAttrError(doc,node,attval,code);
    return;
  }
LAB_001363c0:
  CheckLowerCaseAttrValue(doc,node,attval);
  return;
}

Assistant:

static void CheckSvgAttr( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    if (!nodeIsSVG(node))
    {
        TY_(ReportAttrError)(doc, node, attval, ATTRIBUTE_IS_NOT_ALLOWED);
        return;
    }

    /* Issue #903 - check SVG paint attributes */
    if (IsSvgPaintAttr(attval))
    {
        /* all valid paint attributes have values */
        if (!AttrHasValue(attval))
        {
            TY_(ReportAttrError)(doc, node, attval, MISSING_ATTR_VALUE);
            return;
        }
        /* all paint attributes support an 'inherit' value,
        per https://dev.w3.org/SVG/profiles/1.1F2/publish/painting.html#SpecifyingPaint */
        if (AttrValueIs(attval, "inherit"))
        {
            return;
        }

        /* check paint datatypes
        see https://dev.w3.org/SVG/profiles/1.1F2/publish/painting.html#SpecifyingPaint
        */
        if (attrIsSVG_FILL(attval) || attrIsSVG_STROKE(attval))
        {
            /* TODO: support funciri */
            static ctmbstr const values[] = {
                "none", "currentColor", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                CheckColor(doc, node, attval);
        } 
        else if (attrIsSVG_FILLRULE(attval))
        {
            static ctmbstr const values[] = {"nonzero", "evenodd", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
        }
        else if (attrIsSVG_STROKEDASHARRAY(attval))
        {
            static ctmbstr const values[] = {"none", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
            {
                /* TODO: process dash arrays */
            }
        }
        else if (attrIsSVG_STROKEDASHOFFSET(attval))
        {
            CheckLength(doc, node, attval);
        }
        else if (attrIsSVG_STROKELINECAP(attval))
        {
            static ctmbstr const values[] = {"butt", "round", "square", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
        }
        else if (attrIsSVG_STROKELINEJOIN(attval))
        {
            static ctmbstr const values[] = {"miter", "round", "bevel", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
        }
        else if (attrIsSVG_STROKEMITERLIMIT(attval))
        {
            CheckNumber(doc, node, attval);
        }
        else if (attrIsSVG_STROKEWIDTH(attval))
        {
            CheckLength(doc, node, attval);
        }
        else if (attrIsSVG_COLORINTERPOLATION(attval))
        {
            static ctmbstr const values[] = {"auto", "sRGB", "linearRGB", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
        }
        else if (attrIsSVG_COLORRENDERING(attval))
        {
            static ctmbstr const values[] = {
                "auto", "optimizeSpeed", "optimizeQuality", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
        }
        else if(attrIsSVG_OPACITY(attval))
        {
            CheckDecimal(doc, node, attval);
        }
        else if(attrIsSVG_STROKEOPACITY(attval))
        {
            CheckDecimal(doc, node, attval);
        }
        else if(attrIsSVG_FILLOPACITY(attval))
        {
            CheckDecimal(doc, node, attval);
        }
    }
}